

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc.c++:36:13)>
::getImpl(SimpleTransformPromiseNode<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compat_websocket_rpc_c__:36:13)>
          *this,ExceptionOrValue *output)

{
  undefined8 uVar1;
  Disposer *pDVar2;
  MessageReader *pMVar3;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
  aVar4;
  Array<capnp::word> words;
  ExceptionOr<kj::OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>_> depResult;
  Maybe<capnp::MessageReaderAndFds> local_408;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
  local_3e0;
  MessageReader *local_3d8;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_3d0;
  ArrayPtr<capnp::word> local_3a8;
  ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> local_398;
  ExceptionOrValue local_1f0;
  char local_58;
  OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> local_50;
  
  local_1f0.exception.ptr.isSet = false;
  local_58 = '\0';
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_1f0);
  if (local_1f0.exception.ptr.isSet == true) {
    local_398.super_ExceptionOrValue.exception.ptr.isSet = true;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr =
         local_1f0.exception.ptr.field_1.value.ownFile.content.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_ =
         local_1f0.exception.ptr.field_1.value.ownFile.content.size_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.disposer =
         local_1f0.exception.ptr.field_1.value.ownFile.content.disposer;
    local_1f0.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
    local_1f0.exception.ptr.field_1.value.ownFile.content.size_ = 0;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.file =
         local_1f0.exception.ptr.field_1.value.file;
    local_398.super_ExceptionOrValue.exception.ptr.field_1._32_8_ =
         local_1f0.exception.ptr.field_1._32_8_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.ptr =
         local_1f0.exception.ptr.field_1.value.description.content.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.size_ =
         local_1f0.exception.ptr.field_1.value.description.content.size_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.description.content.disposer =
         local_1f0.exception.ptr.field_1.value.description.content.disposer;
    local_1f0.exception.ptr.field_1.value.description.content.ptr = (char *)0x0;
    local_1f0.exception.ptr.field_1.value.description.content.size_ = 0;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.disposer =
         local_1f0.exception.ptr.field_1.value.context.ptr.disposer;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.context.ptr.ptr =
         local_1f0.exception.ptr.field_1.value.context.ptr.ptr;
    local_1f0.exception.ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.ptr =
         local_1f0.exception.ptr.field_1.value.remoteTrace.content.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.size_ =
         local_1f0.exception.ptr.field_1.value.remoteTrace.content.size_;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.remoteTrace.content.disposer =
         local_1f0.exception.ptr.field_1.value.remoteTrace.content.disposer;
    local_1f0.exception.ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
    local_1f0.exception.ptr.field_1.value.remoteTrace.content.size_ = 0;
    memcpy((void *)((long)&local_398.super_ExceptionOrValue.exception.ptr.field_1 + 0x68),
           (void *)((long)&local_1f0.exception.ptr.field_1 + 0x68),0x105);
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.ptr =
         local_1f0.exception.ptr.field_1.value.details.builder.ptr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.pos =
         local_1f0.exception.ptr.field_1.value.details.builder.pos;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.endPtr =
         local_1f0.exception.ptr.field_1.value.details.builder.endPtr;
    local_398.super_ExceptionOrValue.exception.ptr.field_1.value.details.builder.disposer =
         local_1f0.exception.ptr.field_1.value.details.builder.disposer;
    local_1f0.exception.ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
    local_1f0.exception.ptr.field_1.value.details.builder.pos =
         (RemoveConst<kj::Exception::Detail> *)0x0;
    local_1f0.exception.ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
    local_398.value.ptr.isSet = false;
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)output,
               &local_398);
    aVar4 = local_398.value.ptr.field_1;
    if ((local_398.value.ptr.isSet == true) &&
       (local_398.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
         )0x0)) {
      local_398.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
            )0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar4);
    }
  }
  else {
    if (local_58 != '\x01') goto LAB_0036588a;
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::moveFrom
              (&local_3d0,&local_50);
    uVar1 = local_3d0.field_1._8_8_;
    if (local_3d0.tag == 2) {
      pMVar3 = (MessageReader *)((ulong)local_3d0.field_1._8_8_ >> 3);
      if ((local_3d0.field_1._0_8_ & 7) == 0) {
        local_3e0 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
                     )local_3d0.field_1._0_8_;
        local_3d8 = pMVar3;
        heap<capnp::FlatArrayMessageReader,kj::ArrayPtr<capnp::word>,capnp::ReaderOptions_const&>
                  ((kj *)&local_408,(ArrayPtr<capnp::word> *)&local_3e0.value,&(this->func).options)
        ;
        pDVar2 = (Disposer *)operator_new(0x30);
        pDVar2->_vptr_Disposer = (_func_int **)&PTR___cxa_pure_virtual_006e1418;
        pDVar2[1]._vptr_Disposer = (_func_int **)local_3d0.field_1._0_8_;
        pDVar2[2]._vptr_Disposer = (_func_int **)local_3d0.field_1._8_8_;
        pDVar2[3]._vptr_Disposer = (_func_int **)local_3d0.field_1._16_8_;
        local_3d0.field_1._0_8_ =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
              )0x0;
        local_3d0.field_1._8_8_ = 0;
        pDVar2[4]._vptr_Disposer = (_func_int **)local_408.ptr._0_8_;
        pDVar2[5]._vptr_Disposer = (_func_int **)local_408.ptr.field_1.value.reader.disposer;
        pDVar2->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_006fdc88;
        local_408.ptr.field_1.value.reader.ptr = (MessageReader *)0x1;
        if (local_408.ptr.field_1.value.reader.disposer != (Disposer *)0x0) {
          local_408.ptr.field_1.value.reader.ptr =
               (MessageReader *)local_408.ptr.field_1.value.reader.disposer;
        }
      }
      else {
        local_408.ptr._0_8_ =
             HeapArrayDisposer::allocateImpl
                       (8,(size_t)pMVar3,(size_t)pMVar3,(_func_void_void_ptr *)0x0,
                        (_func_void_void_ptr *)0x0);
        local_408.ptr.field_1.value.reader.ptr = (MessageReader *)&HeapArrayDisposer::instance;
        local_408.ptr.field_1.value.reader.disposer = (Disposer *)pMVar3;
        memcpy((void *)local_408.ptr._0_8_,(void *)local_3d0.field_1._0_8_,
               uVar1 & 0xfffffffffffffff8);
        local_3a8.ptr = (word *)local_408.ptr._0_8_;
        local_3a8.size_ = (size_t)pMVar3;
        heap<capnp::FlatArrayMessageReader,kj::ArrayPtr<capnp::word>,capnp::ReaderOptions_const&>
                  ((kj *)&local_3e0.value,&local_3a8,&(this->func).options);
        pMVar3 = local_3d8;
        pDVar2 = (Disposer *)operator_new(0x30);
        pDVar2->_vptr_Disposer = (_func_int **)&PTR___cxa_pure_virtual_006e1418;
        pDVar2[1]._vptr_Disposer = (_func_int **)local_408.ptr._0_8_;
        pDVar2[2]._vptr_Disposer = (_func_int **)local_408.ptr.field_1.value.reader.disposer;
        pDVar2[3]._vptr_Disposer = (_func_int **)local_408.ptr.field_1.value.reader.ptr;
        local_408.ptr._0_8_ = (_func_int **)0x0;
        *(anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
          *)(pDVar2 + 4) = local_3e0;
        pDVar2[5]._vptr_Disposer = (_func_int **)local_3d8;
        local_3d8 = (MessageReader *)0x0;
        pDVar2->_vptr_Disposer = (_func_int **)&PTR_disposeImpl_006fdd08;
        local_408.ptr.field_1.value.reader.ptr = (MessageReader *)0x1;
        if (pMVar3 != (MessageReader *)0x0) {
          local_408.ptr.field_1.value.reader.ptr = pMVar3;
        }
      }
      local_408.ptr.field_1.value.fds.ptr = (OwnFd *)0x0;
      local_408.ptr.field_1.value.fds.size_ = 0;
      local_408.ptr.isSet = true;
      local_408.ptr.field_1.value.reader.disposer = pDVar2;
      PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<kj::Maybe<capnp::MessageReaderAndFds>>,kj::_::PromiseDisposer,kj::Maybe<capnp::MessageReaderAndFds>>
                ((PromiseDisposer *)&local_3e0.value,&local_408);
      aVar4 = local_3e0;
      uVar1 = local_408.ptr.field_1.value.reader.ptr;
      if (((kj)local_408.ptr.isSet == (kj)0x1) &&
         (local_408.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
        local_408.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
        (**(local_408.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                  (local_408.ptr.field_1.value.reader.disposer,
                   (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                           (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
      }
    }
    else {
      if (local_3d0.tag != 3) {
        if (local_3d0.tag == 1) {
          Debug::Fault::Fault<kj::Exception::Type,char_const(&)[66]>
                    ((Fault *)&local_408,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/websocket-rpc.c++"
                     ,0x2b,FAILED,(char *)0x0,
                     "\"Unexpected websocket text message; expected only binary messages.\"",
                     (char (*) [66])
                     "Unexpected websocket text message; expected only binary messages.");
          Debug::Fault::fatal((Fault *)&local_408);
        }
        unreachable();
      }
      local_408.ptr._0_8_ = local_408.ptr._0_8_ & 0xffffffffffffff00;
      PromiseDisposer::
      alloc<kj::_::ImmediatePromiseNode<kj::Maybe<capnp::MessageReaderAndFds>>,kj::_::PromiseDisposer,kj::Maybe<capnp::MessageReaderAndFds>>
                ((PromiseDisposer *)&local_3e0.value,&local_408);
      aVar4 = local_3e0;
      uVar1 = local_408.ptr.field_1.value.reader.ptr;
      if (((kj)local_408.ptr.isSet == (kj)0x1) &&
         (local_408.ptr.field_1.value.reader.ptr != (MessageReader *)0x0)) {
        local_408.ptr.field_1.value.reader.ptr = (MessageReader *)0x0;
        (**(local_408.ptr.field_1.value.reader.disposer)->_vptr_Disposer)
                  (local_408.ptr.field_1.value.reader.disposer,
                   (code *)((long)((MessageReader *)uVar1)->arenaSpace +
                           (long)(((MessageReader *)uVar1)->_vptr_MessageReader[-2] + -0x18)));
      }
    }
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy(&local_3d0);
    local_398.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_398.value.ptr.isSet = true;
    local_398.value.ptr.field_1 = aVar4;
    ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>::operator=
              ((ExceptionOr<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_> *)output,
               &local_398);
    aVar4 = local_398.value.ptr.field_1;
    if ((local_398.value.ptr.isSet == true) &&
       (local_398.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
         )0x0)) {
      local_398.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::Maybe<capnp::MessageReaderAndFds>_>_>_2
            )0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar4);
    }
  }
  if (local_398.super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&local_398.super_ExceptionOrValue.exception.ptr.field_1.value);
  }
LAB_0036588a:
  if (local_58 == '\x01') {
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::destroy(&local_50);
  }
  if (local_1f0.exception.ptr.isSet == true) {
    Exception::~Exception(&local_1f0.exception.ptr.field_1.value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = ExceptionOr<T>(false, kj::mv(depException));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }